

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

void __thiscall
QDockAreaLayout::addDockWidget
          (QDockAreaLayout *this,DockPosition pos,QDockWidget *dockWidget,Orientation orientation)

{
  QList<QDockAreaLayoutItem> *this_00;
  Data *pDVar1;
  Data *pDVar2;
  QMainWindow *pQVar3;
  QTabBar *pQVar4;
  Representation RVar5;
  DockPosition DVar6;
  Orientation OVar7;
  Representation RVar8;
  Representation RVar9;
  undefined7 uVar10;
  bool bVar11;
  QArrayData *this_01;
  quintptr id;
  QDockAreaLayoutInfo *this_02;
  long in_FS_OFFSET;
  QDockAreaLayoutItem new_item;
  QDockAreaLayoutItem local_d0;
  undefined1 local_a8 [16];
  QPlaceHolderItem *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  QMainWindow *pQStack_70;
  QArrayDataPointer<QDockAreaLayoutItem> local_68;
  undefined1 uStack_50;
  undefined7 uStack_4f;
  QTabBar *local_48;
  int iStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QArrayData *)operator_new(0x18);
  QDockWidgetItem::QDockWidgetItem((QDockWidgetItem *)this_01,dockWidget);
  this_02 = this->docks + pos;
  if ((this->docks[pos].o == orientation) || ((ulong)this->docks[pos].item_list.d.size < 2)) {
    this->docks[pos].o = orientation;
    local_a8._8_8_ = (QDockAreaLayoutInfo *)0x0;
    local_98 = (QPlaceHolderItem *)0x0;
    uStack_90._0_4_ = 0;
    uStack_90._4_4_ = -1;
    local_88._0_4_ = 0;
    local_88._4_4_ = 0xaaaaaaaa;
    this_00 = &this->docks[pos].item_list;
    local_a8._0_8_ = this_01;
    QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::emplace<QDockAreaLayoutItem_const&>
              ((QGenericArrayOps<QDockAreaLayoutItem> *)this_00,this->docks[pos].item_list.d.size,
               (QDockAreaLayoutItem *)local_a8);
    QList<QDockAreaLayoutItem>::end(this_00);
    if ((this->docks[pos].tabbed == true) &&
       (bVar11 = QDockAreaLayoutItem::skip((QDockAreaLayoutItem *)local_a8), !bVar11)) {
      QDockAreaLayoutInfo::updateTabBar(this_02);
      if ((QArrayData *)local_a8._0_8_ == (QArrayData *)0x0) {
        id = 0;
      }
      else {
        id = (**(code **)(*(long *)local_a8._0_8_ + 0x68))();
      }
      QDockAreaLayoutInfo::setCurrentTabId(this_02,id);
    }
    QDockAreaLayoutItem::~QDockAreaLayoutItem((QDockAreaLayoutItem *)local_a8);
  }
  else {
    uStack_4f = 0xaaaaaaaaaaaaaa;
    local_a8._0_8_ = &this->sep;
    pQStack_70 = this->mainWindow;
    local_a8._8_8_ = (QDockAreaLayoutInfo *)0x0;
    local_98 = (QPlaceHolderItem *)0x0;
    uStack_90._0_4_ = 0;
    uStack_90._4_4_ = 0;
    local_88._4_4_ = orientation;
    local_88._0_4_ = pos;
    uStack_80 = 0;
    local_78 = 0xffffffffffffffff;
    local_48 = (QTabBar *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr._0_1_ = 0;
    local_68.ptr._1_7_ = 0;
    local_68.size._0_1_ = 0;
    local_68.size._1_7_ = 0;
    uStack_50 = 0;
    _iStack_40 = CONCAT44(0xaaaaaaaa,this->docks[pos].tabBarShape);
    local_d0.subinfo = (QDockAreaLayoutInfo *)operator_new(0x70);
    (local_d0.subinfo)->sep = this_02->sep;
    pDVar1 = this->docks[pos].separatorWidgets.d.d;
    ((local_d0.subinfo)->separatorWidgets).d.d = pDVar1;
    ((local_d0.subinfo)->separatorWidgets).d.ptr = this->docks[pos].separatorWidgets.d.ptr;
    ((local_d0.subinfo)->separatorWidgets).d.size = this->docks[pos].separatorWidgets.d.size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    DVar6 = this->docks[pos].dockPos;
    OVar7 = this->docks[pos].o;
    RVar8.m_i = this->docks[pos].rect.x1.m_i;
    RVar9.m_i = this->docks[pos].rect.y1.m_i;
    RVar5.m_i = this->docks[pos].rect.y2.m_i;
    pQVar3 = this->docks[pos].mainWindow;
    ((local_d0.subinfo)->rect).x2 = (Representation)this->docks[pos].rect.x2.m_i;
    ((local_d0.subinfo)->rect).y2 = (Representation)RVar5.m_i;
    (local_d0.subinfo)->mainWindow = pQVar3;
    (local_d0.subinfo)->dockPos = DVar6;
    (local_d0.subinfo)->o = OVar7;
    ((local_d0.subinfo)->rect).x1 = (Representation)RVar8.m_i;
    ((local_d0.subinfo)->rect).y1 = (Representation)RVar9.m_i;
    pDVar2 = this->docks[pos].item_list.d.d;
    ((local_d0.subinfo)->item_list).d.d = pDVar2;
    ((local_d0.subinfo)->item_list).d.ptr = this->docks[pos].item_list.d.ptr;
    ((local_d0.subinfo)->item_list).d.size = this->docks[pos].item_list.d.size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    (local_d0.subinfo)->tabBarShape = this->docks[pos].tabBarShape;
    uVar10 = *(undefined7 *)&this->docks[pos].field_0x59;
    pQVar4 = this->docks[pos].tabBar;
    (local_d0.subinfo)->tabbed = this->docks[pos].tabbed;
    *(undefined7 *)&(local_d0.subinfo)->field_0x59 = uVar10;
    (local_d0.subinfo)->tabBar = pQVar4;
    local_d0.widgetItem = (QLayoutItem *)0x0;
    local_d0.placeHolderItem = (QPlaceHolderItem *)0x0;
    local_d0.pos = 0;
    local_d0.size = -1;
    local_d0.flags = 0;
    QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::emplace<QDockAreaLayoutItem>
              ((QGenericArrayOps<QDockAreaLayoutItem> *)&local_68,
               CONCAT71(local_68.size._1_7_,(undefined1)local_68.size),&local_d0);
    QList<QDockAreaLayoutItem>::end((QList<QDockAreaLayoutItem> *)&local_68);
    QDockAreaLayoutItem::~QDockAreaLayoutItem(&local_d0);
    local_d0.subinfo = (QDockAreaLayoutInfo *)0x0;
    local_d0.placeHolderItem = (QPlaceHolderItem *)0x0;
    local_d0.pos = 0;
    local_d0.size = -1;
    local_d0.flags = 0;
    local_d0.widgetItem = (QLayoutItem *)this_01;
    QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::emplace<QDockAreaLayoutItem>
              ((QGenericArrayOps<QDockAreaLayoutItem> *)&local_68,
               CONCAT71(local_68.size._1_7_,(undefined1)local_68.size),&local_d0);
    QList<QDockAreaLayoutItem>::end((QList<QDockAreaLayoutItem> *)&local_68);
    QDockAreaLayoutItem::~QDockAreaLayoutItem(&local_d0);
    this_02->sep = (int *)local_a8._0_8_;
    QArrayDataPointer<QWidget_*>::operator=
              (&this->docks[pos].separatorWidgets.d,(QArrayDataPointer<QWidget_*> *)(local_a8 + 8));
    this->docks[pos].dockPos = (uint)local_88;
    this->docks[pos].o = local_88._4_4_;
    this->docks[pos].rect.x1 = (Representation)(undefined4)uStack_80;
    this->docks[pos].rect.y1 = (Representation)uStack_80._4_4_;
    this->docks[pos].rect.x2 = (Representation)(undefined4)local_78;
    this->docks[pos].rect.y2 = (Representation)local_78._4_4_;
    this->docks[pos].mainWindow = pQStack_70;
    QArrayDataPointer<QDockAreaLayoutItem>::operator=(&this->docks[pos].item_list.d,&local_68);
    *(ulong *)&this->docks[pos].tabbed = CONCAT71(uStack_4f,uStack_50);
    this->docks[pos].tabBar = local_48;
    this->docks[pos].tabBarShape = iStack_40;
    QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&local_68);
    if ((QDockAreaLayoutInfo *)local_a8._8_8_ != (QDockAreaLayoutInfo *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_a8._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_a8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_a8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_a8._8_8_,8,0x10);
      }
    }
  }
  QObject::objectName();
  removePlaceHolder(this,(QString *)local_a8);
  if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockAreaLayout::addDockWidget(QInternal::DockPosition pos, QDockWidget *dockWidget,
                                             Qt::Orientation orientation)
{
    QLayoutItem *dockWidgetItem = new QDockWidgetItem(dockWidget);
    QDockAreaLayoutInfo &info = docks[pos];
    if (orientation == info.o || info.item_list.size() <= 1) {
        // empty dock areas, or dock areas containing exactly one widget can have their orientation
        // switched.
        info.o = orientation;

        QDockAreaLayoutItem new_item(dockWidgetItem);
        info.item_list.append(new_item);
#if QT_CONFIG(tabbar)
        if (info.tabbed && !new_item.skip()) {
            info.updateTabBar();
            info.setCurrentTabId(tabId(new_item));
        }
#endif
    } else {
#if QT_CONFIG(tabbar)
        int tbshape = info.tabBarShape;
#else
        int tbshape = 0;
#endif
        QDockAreaLayoutInfo new_info(&sep, pos, orientation, tbshape, mainWindow);
        new_info.item_list.append(QDockAreaLayoutItem(new QDockAreaLayoutInfo(info)));
        new_info.item_list.append(QDockAreaLayoutItem(dockWidgetItem));
        info = new_info;
    }

    removePlaceHolder(dockWidget->objectName());
}